

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O1

void Abc_SclPrintCells(SC_Lib *p,float SlewInit,float Gain,int fInvOnly,int fShort)

{
  void **ppvVar1;
  undefined8 *puVar2;
  SC_Cell *pSVar3;
  void *pvVar4;
  int iVar5;
  SC_Cell *pCell;
  size_t sVar6;
  SC_Cell *pSVar7;
  undefined8 *puVar8;
  long lVar9;
  int Count;
  uint uVar10;
  uint uVar11;
  char *pcVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  float fVar16;
  float PD;
  float LD;
  float local_70;
  float local_68;
  float local_64;
  double local_60;
  long local_58;
  int local_4c;
  SC_Lib *local_48;
  double local_40;
  double local_38;
  
  local_58 = CONCAT44(local_58._4_4_,Gain);
  local_70 = SlewInit;
  local_4c = fInvOnly;
  if ((SlewInit == 0.0) && (!NAN(SlewInit))) {
    local_70 = Abc_SclComputeAverageSlew(p);
  }
  local_64 = 0.0;
  local_68 = 0.0;
  if ((p->vCellClasses).nSize < 1) {
    __assert_fail("Vec_PtrSize(&p->vCellClasses) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLibUtil.c"
                  ,0x283,"void Abc_SclPrintCells(SC_Lib *, float, float, int, int)");
  }
  uVar15 = 0;
  printf("Library \"%s\" ",p->pName);
  printf("has %d cells in %d classes.  ",(ulong)(uint)(p->vCells).nSize,
         (ulong)(uint)(p->vCellClasses).nSize);
  local_60 = (double)(float)local_58;
  if (fShort == 0) {
    printf("Delay estimate is based on slew %.2f ps and gain %.2f.",(double)local_70,local_60);
  }
  putchar(10);
  Abc_SclMarkSkippedCells(p);
  lVar9 = (long)(p->vCellClasses).nSize;
  if (0 < lVar9) {
    ppvVar1 = (p->vCellClasses).pArray;
    lVar13 = 0;
    uVar15 = 0;
    do {
      puVar2 = (undefined8 *)ppvVar1[lVar13];
      sVar6 = strlen((char *)*puVar2);
      puVar8 = puVar2;
      do {
        if ((int)uVar15 <= (int)(uint)sVar6) {
          uVar15 = (uint)sVar6;
        }
        puVar8 = (undefined8 *)puVar8[9];
      } while (puVar8 != puVar2);
      lVar13 = lVar13 + 1;
    } while (lVar13 != lVar9);
  }
  if ((p->vCellClasses).nSize < 1) {
    return;
  }
  local_60 = local_60 * 0.01;
  local_58 = 0;
  local_48 = p;
LAB_003f0b48:
  pSVar3 = (SC_Cell *)(local_48->vCellClasses).pArray[local_58];
  if ((local_4c == 0) || (pSVar3->n_inputs == 1)) {
    uVar11 = pSVar3->n_inputs;
    uVar14 = (ulong)uVar11;
    if ((int)uVar11 < (pSVar3->vPins).nSize) {
      do {
        if ((int)uVar11 < 0) goto LAB_003f0eb9;
        pvVar4 = (pSVar3->vPins).pArray[uVar14];
        if (uVar14 == (uint)pSVar3->n_inputs) {
          uVar10 = 0;
          printf("Class%4d : ",local_58);
          pSVar7 = pSVar3;
          do {
            uVar10 = uVar10 + (pSVar7->fSkip == 0);
            pSVar7 = pSVar7->pNext;
          } while (pSVar7 != pSVar3);
          printf("Cells =%3d   ",(ulong)uVar10);
          printf("Ins =%2d  ",(ulong)(uint)pSVar3->n_inputs);
          printf("Outs =%2d  ",(ulong)(uint)pSVar3->n_outputs);
        }
        else {
          printf("                                            ");
        }
        if (*(long *)((long)pvVar4 + 0x28) != 0) {
          printf("%-30s");
        }
        printf("    ");
        Kit_DsdPrintFromTruth(*(uint **)((long)pvVar4 + 0x38),pSVar3->n_inputs);
        putchar(10);
        if (fShort == 0) {
          uVar11 = 0;
          pSVar7 = pSVar3;
          goto LAB_003f0c57;
        }
        uVar14 = uVar14 + 1;
      } while ((int)uVar14 < (pSVar3->vPins).nSize);
    }
  }
  goto LAB_003f0e90;
LAB_003f0c57:
  do {
    uVar11 = uVar11 + 1;
    printf("  %3d ",(ulong)uVar11);
    pcVar12 = "s";
    if (pSVar7->fSkip == 0) {
      pcVar12 = " ";
    }
    printf("%s",pcVar12);
    printf(" : ");
    printf("%-*s  ",(ulong)uVar15,pSVar7->pName);
    printf("%2d   ",(ulong)(uint)pSVar7->drive_strength);
    printf("A =%8.2f  ",(double)pSVar7->area);
    pcVar12 = "L =%8.2f  ";
    printf("L =%8.2f  ",(double)pSVar7->leakage);
    if ((pSVar7->n_outputs == 1) &&
       (iVar5 = Abc_SclComputeParametersCell((SC_Lib *)pcVar12,pSVar7,local_70,&local_64,&local_68),
       iVar5 != 0)) {
      local_40 = (double)local_64;
      local_38 = (double)local_68;
      printf("D =%6.1f ps  ",local_60 * local_40 + local_38);
      printf("LD =%6.1f ps  ",local_40);
      printf("PD =%6.1f ps    ",local_38);
      iVar5 = pSVar7->n_inputs;
      if ((long)iVar5 < 1) {
        fVar16 = 0.0;
      }
      else {
        uVar10 = (pSVar7->vPins).nSize;
        if ((int)uVar10 < 1) {
          uVar10 = 0;
        }
        if (uVar10 <= iVar5 - 1U) {
LAB_003f0eb9:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        fVar16 = 0.0;
        lVar9 = 0;
        do {
          pvVar4 = (pSVar7->vPins).pArray[lVar9];
          fVar16 = fVar16 + *(float *)((long)pvVar4 + 0x10) * 0.5 +
                            *(float *)((long)pvVar4 + 0x14) * 0.5;
          lVar9 = lVar9 + 1;
        } while (iVar5 != lVar9);
      }
      if (iVar5 < 2) {
        iVar5 = 1;
      }
      printf("C =%5.1f ff  ",(double)(fVar16 / (float)iVar5));
      iVar5 = pSVar7->n_inputs;
      if (((long)iVar5 < 0) || ((pSVar7->vPins).nSize <= iVar5)) goto LAB_003f0eb9;
      printf("Cm =%5.0f ff    ",(double)*(float *)((long)(pSVar7->vPins).pArray[iVar5] + 0x20));
      iVar5 = pSVar7->n_inputs;
      if (((long)iVar5 < 0) || ((pSVar7->vPins).nSize <= iVar5)) goto LAB_003f0eb9;
      printf("Sm =%5.1f ps ",(double)*(float *)((long)(pSVar7->vPins).pArray[iVar5] + 0x24));
    }
    putchar(10);
    pSVar7 = pSVar7->pNext;
  } while (pSVar7 != pSVar3);
LAB_003f0e90:
  local_58 = local_58 + 1;
  if ((local_48->vCellClasses).nSize <= local_58) {
    return;
  }
  goto LAB_003f0b48;
}

Assistant:

void Abc_SclPrintCells( SC_Lib * p, float SlewInit, float Gain, int fInvOnly, int fShort )
{
    SC_Cell * pCell, * pRepr;
    SC_Pin * pPin;
    int i, j, k, nLength = 0;
    float Slew = (SlewInit == 0) ? Abc_SclComputeAverageSlew(p) : SlewInit;
    float LD = 0, PD = 0;
    assert( Vec_PtrSize(&p->vCellClasses) > 0 );
    printf( "Library \"%s\" ", p->pName );
    printf( "has %d cells in %d classes.  ", 
        Vec_PtrSize(&p->vCells), Vec_PtrSize(&p->vCellClasses) );
    if ( !fShort )
        printf( "Delay estimate is based on slew %.2f ps and gain %.2f.", Slew, Gain );
    printf( "\n" );
    Abc_SclMarkSkippedCells( p );
    // find the longest name
    SC_LibForEachCellClass( p, pRepr, k )
        SC_RingForEachCell( pRepr, pCell, i )
            nLength = Abc_MaxInt( nLength, strlen(pRepr->pName) );
    // print cells
    SC_LibForEachCellClass( p, pRepr, k )
    {
        if ( fInvOnly && pRepr->n_inputs != 1 )
            continue;
        SC_CellForEachPinOut( pRepr, pPin, i )
        {
            if ( i == pRepr->n_inputs )
            {
                printf( "Class%4d : ",   k );
                printf( "Cells =%3d   ", Abc_SclClassCellNum(pRepr) );
                printf( "Ins =%2d  ",    pRepr->n_inputs );
                printf( "Outs =%2d  ",   pRepr->n_outputs );
            }
            else
                printf( "                                            " );
            if ( pPin->func_text )
                printf( "%-30s", pPin->func_text  );
            printf( "    "  );
            Kit_DsdPrintFromTruth( (unsigned *)Vec_WrdArray(&pPin->vFunc), pRepr->n_inputs );
            printf( "\n" );
            if ( fShort )
                continue;
            SC_RingForEachCell( pRepr, pCell, j )
            {
                printf( "  %3d ",           j+1 );
                printf( "%s",               pCell->fSkip ? "s" : " " );
                printf( " : " );
                printf( "%-*s  ",           nLength, pCell->pName );
                printf( "%2d   ",           pCell->drive_strength );
                printf( "A =%8.2f  ",       pCell->area );
                printf( "L =%8.2f  ",       pCell->leakage );
                if ( pCell->n_outputs == 1 )
                {
                    if ( Abc_SclComputeParametersCell( p, pCell, Slew, &LD, &PD ) )
                    {
                        printf( "D =%6.1f ps  ",    0.01 * Gain * LD + PD );
                        printf( "LD =%6.1f ps  ",   LD );
                        printf( "PD =%6.1f ps    ", PD );
                        printf( "C =%5.1f ff  ",    SC_CellPinCapAve(pCell) );
                        printf( "Cm =%5.0f ff    ", SC_CellPin(pCell, pCell->n_inputs)->max_out_cap );
                        printf( "Sm =%5.1f ps ",    SC_CellPin(pCell, pCell->n_inputs)->max_out_slew );
                    }
                }
                printf( "\n" );
            }
            break;
        }
    }
}